

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::markOneDirectionInEdges(Graph *this)

{
  bool bVar1;
  int originID;
  int destinyID;
  Vertex *pVVar2;
  Edge *this_00;
  Edge *local_28;
  Edge *a;
  Vertex *no;
  Edge *aux;
  Graph *this_local;
  
  resetEdgesMarking(this);
  for (a = (Edge *)this->verticesList; a != (Edge *)0x0; a = (Edge *)Vertex::getNext((Vertex *)a)) {
    for (local_28 = Vertex::getEdgesList((Vertex *)a); local_28 != (Edge *)0x0;
        local_28 = Edge::getNext(local_28)) {
      bVar1 = Edge::getMarked(local_28);
      if (!bVar1) {
        Edge::setMarked(local_28,false);
        pVVar2 = Edge::getDestiny(local_28);
        originID = Vertex::getID(pVVar2);
        pVVar2 = Edge::getOrigin(local_28);
        destinyID = Vertex::getID(pVVar2);
        this_00 = findEdge(this,originID,destinyID);
        Edge::setMarked(this_00,true);
      }
    }
  }
  return;
}

Assistant:

void Graph::markOneDirectionInEdges(){
    this->resetEdgesMarking();
    Edge *aux;
    for(Vertex *no = this->verticesList; no != NULL; no = no->getNext()){

        for(Edge *a = no->getEdgesList(); a != NULL; a = a->getNext()){

            if(a->getMarked() == false){
                a->setMarked(false);
                aux = this->findEdge(a->getDestiny()->getID(), a->getOrigin()->getID());
                aux->setMarked(true);
            }

        }
    }
}